

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

result_t * sequenceFunc(result_t *__return_storage_ptr__,Env *env,shared_ptr<SpadeArguments> *args)

{
  ostringstream *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  InvertDatabase *this_00;
  result_t *prVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *ctx_00;
  ulong uVar7;
  shared_ptr<InvertDatabase> invdb;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> numLargeItemset;
  shared_ptr<Partition> partition;
  shared_ptr<ClassInfo> cls;
  Sequence sequence;
  InvertDatabase *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  Partition *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  shared_ptr<ClassInfo> local_110;
  result_t *local_100;
  string local_f8;
  undefined7 uStack_f7;
  undefined1 local_e8 [16];
  Sequence local_d8;
  
  local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.l_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.l_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.e_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.e_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.m_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.m_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.FreqArray.
  super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.FreqArray.
  super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.FreqArraySz = 100;
  local_d8.FreqArrayPos = 0;
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.env = env;
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  local_128->_M_use_count = 1;
  local_128->_M_weak_count = 1;
  local_128->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00123700;
  local_130 = local_128 + 1;
  local_128[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_128[1]._M_use_count = 0;
  local_128[1]._M_weak_count = 0;
  local_128[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1 = &local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (ClassInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ClassInfo,std::allocator<ClassInfo>>
            (p_Var1,(ClassInfo **)&local_110,(allocator<ClassInfo> *)&local_f8);
  local_120 = (Partition *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Partition,std::allocator<Partition>>
            (&local_118,&local_120,(allocator<Partition> *)&local_f8);
  local_140 = (InvertDatabase *)0x0;
  local_100 = __return_storage_ptr__;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<InvertDatabase,std::allocator<InvertDatabase>,Env&>
            (&local_138,&local_140,(allocator<InvertDatabase> *)&local_f8,env);
  ctx_00 = (EVP_PKEY_CTX *)&local_128;
  local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             p_Var1);
  local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_140;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_138);
  local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_120;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_118);
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130;
  p_Var1 = &local_d8.numLargeItemset.
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var1,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)ctx_00);
  ClassInfo::setArgs(local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,args
                    );
  Partition::set_args(local_120,args);
  InvertDatabase::set_cls(local_140,&local_110);
  InvertDatabase::setArgs(local_140,args);
  ctx = (EVP_PKEY_CTX *)&local_120;
  InvertDatabase::setPartition(local_140,(shared_ptr<Partition> *)ctx);
  ClassInfo::init(local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ctx);
  prVar3 = local_100;
  peVar2 = (args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar4 = peVar2->num_partitions;
  InvertDatabase::init
            (local_140,
             (EVP_PKEY_CTX *)(ulong)(uint)(iVar4 + (iVar4 + peVar2->total_trans_count + -1) / iVar4)
            );
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var1,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)ctx_00);
  Partition::init(local_120,ctx_00);
  Partition::partition_alloc(local_120);
  Sequence::read_files(&local_d8);
  this_00 = local_140;
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_maxgap !=
      '\0') {
    iVar4 = ClassInfo::get_num_class
                      (local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (*(_func_int ***)&local_130->_M_use_count == local_130->_vptr__Sp_counted_base) {
      uVar7 = 0;
      uVar6 = 0;
LAB_0010c03b:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
                 uVar6);
    }
    InvertDatabase::init_buffer(this_00,iVar4,*(int *)local_130->_vptr__Sp_counted_base);
  }
  Sequence::newSeq(&local_d8);
  this = &env->summary;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"SPADE",5);
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_hash != 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," USEHASH",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  peVar2 = (args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(peVar2->dataf)._M_dataplus._M_p,
                      (peVar2->dataf)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = std::ostream::_M_insert<double>
                     (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_support_per_class);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_support);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->num_intersect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->pruning_type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->L2pruning);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->prepruning);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ostream::operator<<
            ((ostream *)poVar5,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             postpruning);
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_window ==
      '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," 0",2);
    if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_maxgap
        == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," -1",3);
      goto LAB_0010bde8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    poVar5 = (ostream *)this;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    local_f8 = (string)((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->use_window;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_f8,1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  }
  std::ostream::operator<<
            ((ostream *)poVar5,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             max_gap);
LAB_0010bde8:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)this,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_gap);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->max_iset_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ostream::operator<<
            ((ostream *)poVar5,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             max_seq_len);
  if (*(_func_int ***)&local_130->_M_use_count != local_130->_vptr__Sp_counted_base) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
      uVar6 = *(long *)&local_130->_M_use_count - (long)local_130->_vptr__Sp_counted_base >> 2;
      if (uVar6 <= uVar7) goto LAB_0010c03b;
      std::ostream::operator<<
                ((ostream *)this,*(int *)((long)local_130->_vptr__Sp_counted_base + uVar7 * 4));
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(*(long *)&local_130->_M_use_count -
                             (long)local_130->_vptr__Sp_counted_base >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  std::ostream::put((char)this);
  std::ostream::flush();
  (prVar3->seqstrm)._M_dataplus._M_p = (pointer)&(prVar3->seqstrm).field_2;
  (prVar3->seqstrm)._M_string_length = 0;
  (prVar3->seqstrm).field_2._M_local_buf[0] = '\0';
  (prVar3->logger)._M_dataplus._M_p = (pointer)&(prVar3->logger).field_2;
  (prVar3->logger)._M_string_length = 0;
  (prVar3->logger).field_2._M_local_buf[0] = '\0';
  (prVar3->summary)._M_dataplus._M_p = (pointer)&(prVar3->summary).field_2;
  (prVar3->summary)._M_string_length = 0;
  (prVar3->summary).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->summary,&local_f8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->logger,&local_f8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->seqstrm,&local_f8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8));
  }
  prVar3->nsequences =
       ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       total_trans_count;
  if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  if (local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  Sequence::~Sequence(&local_d8);
  return prVar3;
}

Assistant:

result_t sequenceFunc(Env& env, const shared_ptr<SpadeArguments>& args) {
    Sequence sequence(env);
    shared_ptr<vint> numLargeItemset = make_shared<vint>();
    shared_ptr<ClassInfo> cls = make_shared<ClassInfo>();
    shared_ptr<Partition> partition = make_shared<Partition>();
    shared_ptr<InvertDatabase> invdb = make_shared<InvertDatabase>(env);
//    shared_ptr<ItemBufferManager> ibm = make_shared<ItemBufferManager>();

    sequence.set_args(args);
//    sequence.set_ibm(ibm);
    sequence.set_cls(cls);
    sequence.set_invdb(invdb);
    sequence.set_partition(partition);
    sequence.set_num_large_dataset(numLargeItemset);

    cls->setArgs(args);

    partition->set_args(args);

    invdb->set_cls(cls);
    invdb->setArgs(args);
    invdb->setPartition(partition);

    ostringstream &summary = env.summary;
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    cls->init();

    int external_block_size =
            args->num_partitions + (args->total_trans_count + args->num_partitions - 1) / args->num_partitions;
    invdb->init(external_block_size);
    sequence.set_num_large_dataset(numLargeItemset);

    partition->init();
    partition->partition_alloc();

    int i;
    sequence.read_files();

    if (args->use_maxgap) {
        invdb->init_buffer(cls->get_num_class(), numLargeItemset->at(0));
    }

    sequence.newSeq();

    summary << "SPADE";

    if (args->use_hash) {
        summary << " USEHASH";
    }
    summary << " " << args->dataf << " " << args->min_support_per_class << " " << args->min_support << " "
            << args->num_intersect << " " << args->pruning_type << " " << args->L2pruning << " " << args->prepruning
            << " " << args->postpruning;
    if (args->use_window) {
        summary << " " << args->use_window << " " << args->max_gap;
    } else {
        summary << " 0";
        if (args->use_maxgap) {
            summary << " " << args->max_gap;
        } else {
            summary << " -1";
        }
    }

    summary << " " << args->min_gap << " " << args->max_iset_len << " " << args->max_seq_len;

    for (i = 0; i < numLargeItemset->size(); i++) {
        summary << " " << numLargeItemset->at(i);
    }
    summary << endl;
    result_t result;
    result.summary = summary.str();
    result.logger = logger.str();
    result.seqstrm = seqstrm.str();
    result.nsequences = args->total_trans_count;

    return result;
}